

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

Lf_Cut_t * Lf_ObjCutBestNew(Lf_Man_t *p,int i,Lf_Cut_t *pCut)

{
  uint uVar1;
  Lf_Bst_t *p_00;
  
  p_00 = Lf_ObjReadBest(p,i);
  uVar1 = Lf_BestCutIndex(p_00);
  pCut->Delay = p_00->Delay[uVar1];
  pCut->Flow = p_00->Flow[uVar1];
  if (uVar1 == 2) {
    Lf_MemLoadMuxCut(p,i,pCut);
  }
  else {
    Lf_MemLoadCut(&p->vStoreNew,(uint)p_00->Cut[uVar1] >> 1,i,pCut,0,0);
  }
  return pCut;
}

Assistant:

static inline Lf_Cut_t * Lf_ObjCutBestNew( Lf_Man_t * p, int i, Lf_Cut_t * pCut )
{
    Lf_Bst_t * pBest = Lf_ObjReadBest( p, i );
    int Index = Lf_BestCutIndex( pBest );
    pCut->Delay = pBest->Delay[Index];
    pCut->Flow  = pBest->Flow[Index];
    if ( Index == 2 )
        return Lf_MemLoadMuxCut( p, i, pCut );
    return Lf_MemLoadCut( &p->vStoreNew, pBest->Cut[Index].Handle, i, pCut, 0, 0 );
}